

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

word Nf_MatchRef_rec(Nf_Man_t *p,int i,int c,Nf_Mat_t *pM,word Required,Vec_Int_t *vBackup)

{
  int iVar1;
  int *pCutSet;
  uint *puVar2;
  word wVar3;
  uint uVar4;
  word *pwVar5;
  byte bVar6;
  uint c_00;
  ulong uVar7;
  bool bVar8;
  word local_60;
  
  if (-1 < (int)*(uint *)pM) {
    __assert_fail("pM->fBest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6ba,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if (Required < pM->D) {
    __assert_fail("pM->D <= Required",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                  ,0x6bb,"word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)"
                 );
  }
  if ((*(uint *)pM >> 0x1e & 1) == 0) {
    iVar1 = Vec_IntEntry(&p->vCutSets,i);
    bVar6 = 0;
    if (iVar1 == 0) {
      return 0;
    }
    pCutSet = Nf_ObjCutSet(p,i);
    puVar2 = (uint *)Nf_CutFromHandle(pCutSet,*(uint *)pM >> 0x14 & 0x3ff);
    local_60 = 0;
    for (uVar7 = 0; uVar7 < (*puVar2 & 0x1f); uVar7 = uVar7 + 1) {
      uVar4 = puVar2[(ulong)(((uint)pM->Cfg >> 8) >> (bVar6 & 0x1f) & 0xf) + 1];
      if ((long)(int)uVar4 == 0) break;
      bVar8 = (((uint)pM->Cfg >> 1 & 0x7f) >> ((uint)uVar7 & 0x1f) & 1) != 0;
      wVar3 = p->pCells[*(uint *)pM & 0xfffff].Delays[uVar7];
      c_00 = (uint)bVar8;
      if (vBackup != (Vec_Int_t *)0x0) {
        iVar1 = Abc_Var2Lit(uVar4,c_00);
        Vec_IntPush(vBackup,iVar1);
      }
      iVar1 = Nf_ObjMapRefNum(p,uVar4,c_00);
      if (iVar1 < 0) {
        __assert_fail("Nf_ObjMapRefNum(p, iVar, fCompl) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                      ,0x6ce,
                      "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)");
      }
      iVar1 = Nf_ObjMapRefInc(p,uVar4,c_00);
      if (iVar1 == 0) {
        wVar3 = Nf_MatchRef_rec(p,uVar4,c_00,p->pNfObjs[(int)uVar4].M[bVar8],Required - wVar3,
                                vBackup);
        local_60 = local_60 + wVar3;
      }
      bVar6 = bVar6 + 4;
    }
    pwVar5 = &p->pCells[*(uint *)pM & 0xfffff].Area;
  }
  else {
    wVar3 = p->InvDelay;
    if (vBackup != (Vec_Int_t *)0x0) {
      iVar1 = Abc_Var2Lit(i,(uint)(c == 0));
      Vec_IntPush(vBackup,iVar1);
    }
    uVar4 = (uint)(c == 0);
    iVar1 = Nf_ObjMapRefNum(p,i,uVar4);
    if (iVar1 < 0) {
      __assert_fail("Nf_ObjMapRefNum(p, i, !c) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x6c1,
                    "word Nf_MatchRef_rec(Nf_Man_t *, int, int, Nf_Mat_t *, word, Vec_Int_t *)");
    }
    iVar1 = Nf_ObjMapRefInc(p,i,uVar4);
    if (iVar1 == 0) {
      local_60 = Nf_MatchRef_rec(p,i,uVar4,p->pNfObjs[i].M[c == 0],Required - wVar3,vBackup);
    }
    else {
      local_60 = 0;
    }
    pwVar5 = &p->InvArea;
  }
  return local_60 + *pwVar5;
}

Assistant:

word Nf_MatchRef_rec( Nf_Man_t * p, int i, int c, Nf_Mat_t * pM, word Required, Vec_Int_t * vBackup )
{
    word Area = 0, ReqFanin;
    int k, iVar, fCompl, * pCut;
    assert( pM->fBest );
    assert( pM->D <= Required );
    if ( pM->fCompl )
    {
        ReqFanin = Required - p->InvDelay;
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(i, !c) );
        assert( Nf_ObjMapRefNum(p, i, !c) >= 0 );
        if ( !Nf_ObjMapRefInc(p, i, !c) )
            Area += Nf_MatchRef_rec( p, i, !c, Nf_ObjMatchD(p, i, !c), ReqFanin, vBackup );
        return Area + p->InvArea;
    }
    if ( Nf_ObjCutSetId(p, i) == 0 )
        return 0;
    pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pM->CutH );
    Nf_CutForEachVarCompl( pCut, pM->Cfg, iVar, fCompl, k )
    {
        ReqFanin = Required - Nf_ManCell(p, pM->Gate)->Delays[k];
        if ( vBackup )
            Vec_IntPush( vBackup, Abc_Var2Lit(iVar, fCompl) );
        assert( Nf_ObjMapRefNum(p, iVar, fCompl) >= 0 );
        if ( !Nf_ObjMapRefInc(p, iVar, fCompl) )
            Area += Nf_MatchRef_rec( p, iVar, fCompl, Nf_ObjMatchD(p, iVar, fCompl), ReqFanin, vBackup );
    }
    return Area + Nf_ManCell(p, pM->Gate)->Area;
}